

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.h
# Opt level: O1

void __thiscall
ModuleAnnotator::annotate
          (ModuleAnnotator *this,
          set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *criteria)

{
  bool bVar1;
  UndefinedFunsBehavior UVar2;
  AnnotationOptsT AVar3;
  pointer pcVar4;
  LLVMDependenceGraph *pLVar5;
  long lVar6;
  char cVar7;
  long *plVar8;
  undefined8 *puVar9;
  raw_ostream *prVar10;
  long *plVar11;
  ulong *puVar12;
  char **ppcVar13;
  ulong uVar14;
  char cVar15;
  ulong uVar16;
  char *pcVar17;
  StringRef Str;
  StringRef Str_00;
  string ret;
  string __str_2;
  string module_comment;
  string __str_1;
  string __str;
  string fl;
  raw_os_ostream outputstream;
  ofstream ofs;
  uint *local_540;
  char *local_538;
  uint local_530;
  uint uStack_52c;
  long *local_520;
  undefined8 local_518;
  long local_510;
  undefined8 uStack_508;
  long *local_500;
  long local_4f8;
  long local_4f0;
  long lStack_4e8;
  long *local_4e0;
  undefined8 local_4d8;
  long local_4d0;
  undefined8 uStack_4c8;
  ulong *local_4c0;
  long local_4b8;
  ulong local_4b0;
  long lStack_4a8;
  long *local_4a0;
  undefined8 local_498;
  long local_490;
  undefined8 uStack_488;
  long *local_480;
  long local_478;
  long local_470;
  long lStack_468;
  ulong *local_460;
  long local_458;
  ulong local_450 [2];
  ulong *local_440;
  long local_438;
  ulong local_430;
  long lStack_428;
  char **local_420;
  long local_418;
  char *local_410;
  long lStack_408;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *local_400;
  ulong *local_3f8;
  long local_3f0;
  ulong local_3e8 [2];
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8;
  long local_3b0;
  long local_3a8;
  long lStack_3a0;
  long *local_398;
  long local_390;
  long local_388;
  long lStack_380;
  long *local_378;
  long local_370;
  long local_368;
  long lStack_360;
  long *local_358;
  long local_350;
  long local_348;
  long lStack_340;
  long *local_338;
  long local_330;
  long local_328;
  long lStack_320;
  long *local_318;
  long local_310;
  long local_308;
  long lStack_300;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  code *local_298;
  undefined4 local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined1 local_270;
  undefined8 local_268;
  undefined4 local_260;
  string *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long *local_230;
  filebuf local_228 [8];
  long local_220 [29];
  ios_base local_138 [264];
  
  local_3d8[0] = local_3c8;
  pcVar4 = (this->options->inputFile)._M_dataplus._M_p;
  local_400 = criteria;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3d8,pcVar4,pcVar4 + (this->options->inputFile)._M_string_length);
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"-debug.ll","");
  replace_suffix((string *)local_3d8,(string *)&local_230);
  if (local_230 != local_220) {
    operator_delete(local_230,local_220[0] + 1);
  }
  std::ofstream::ofstream((string *)&local_230,(string *)local_3d8,_S_out);
  local_290 = 0;
  local_270 = 0;
  local_268 = 0;
  local_260 = 1;
  local_288 = 0;
  uStack_280 = 0;
  local_278 = 0;
  local_298 = std::__cxx11::stringbuf::str;
  local_258 = (string *)&local_230;
  std::operator+(&local_250,"; -- Generated by llvm-slicer --\n;   * slicing criteria: \'",
                 &this->options->slicingCriteria);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_3b8 = &local_3a8;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_3a8 = *plVar11;
    lStack_3a0 = plVar8[3];
  }
  else {
    local_3a8 = *plVar11;
    local_3b8 = (long *)*plVar8;
  }
  local_3b0 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_3b8);
  local_398 = &local_388;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_388 = *plVar11;
    lStack_380 = plVar8[3];
  }
  else {
    local_388 = *plVar11;
    local_398 = (long *)*plVar8;
  }
  local_390 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_398,
                              (ulong)(this->options->legacySlicingCriteria)._M_dataplus._M_p);
  local_378 = &local_368;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_368 = *plVar11;
    lStack_360 = plVar8[3];
  }
  else {
    local_368 = *plVar11;
    local_378 = (long *)*plVar8;
  }
  local_370 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_378);
  local_358 = &local_348;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_348 = *plVar11;
    lStack_340 = plVar8[3];
  }
  else {
    local_348 = *plVar11;
    local_358 = (long *)*plVar8;
  }
  local_350 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_358);
  local_338 = &local_328;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_328 = *plVar11;
    lStack_320 = plVar8[3];
  }
  else {
    local_328 = *plVar11;
    local_338 = (long *)*plVar8;
  }
  local_330 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_338,
                              (ulong)(this->options->legacySecondarySlicingCriteria)._M_dataplus.
                                     _M_p);
  local_318 = &local_308;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_308 = *plVar11;
    lStack_300 = plVar8[3];
  }
  else {
    local_308 = *plVar11;
    local_318 = (long *)*plVar8;
  }
  local_310 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_318);
  local_2f8 = &local_2e8;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_2e8 = *plVar11;
    lStack_2e0 = plVar8[3];
  }
  else {
    local_2e8 = *plVar11;
    local_2f8 = (long *)*plVar8;
  }
  local_2f0 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_430 = *puVar12;
    lStack_428 = plVar8[3];
    local_440 = &local_430;
  }
  else {
    local_430 = *puVar12;
    local_440 = (ulong *)*plVar8;
  }
  local_438 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  bVar1 = this->options->forwardSlicing;
  local_3f8 = local_3e8;
  std::__cxx11::string::_M_construct((ulong)&local_3f8,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_3f8,1,(uint)bVar1);
  uVar16 = 0xf;
  if (local_440 != &local_430) {
    uVar16 = local_430;
  }
  if (uVar16 < (ulong)(local_3f0 + local_438)) {
    uVar16 = 0xf;
    if (local_3f8 != local_3e8) {
      uVar16 = local_3e8[0];
    }
    if (uVar16 < (ulong)(local_3f0 + local_438)) goto LAB_00119a1d;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3f8,0,(char *)0x0,(ulong)local_440);
  }
  else {
LAB_00119a1d:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_3f8);
  }
  local_4e0 = &local_4d0;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_4d0 = *plVar8;
    uStack_4c8 = puVar9[3];
  }
  else {
    local_4d0 = *plVar8;
    local_4e0 = (long *)*puVar9;
  }
  local_4d8 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_4e0);
  local_2d8 = &local_2c8;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_2c8 = *plVar11;
    lStack_2c0 = plVar8[3];
  }
  else {
    local_2c8 = *plVar11;
    local_2d8 = (long *)*plVar8;
  }
  local_2d0 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_4b0 = *puVar12;
    lStack_4a8 = plVar8[3];
    local_4c0 = &local_4b0;
  }
  else {
    local_4b0 = *puVar12;
    local_4c0 = (ulong *)*plVar8;
  }
  local_4b8 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  bVar1 = this->options->removeSlicingCriteria;
  local_460 = local_450;
  std::__cxx11::string::_M_construct((ulong)&local_460,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_460,1,(uint)bVar1);
  uVar16 = 0xf;
  if (local_4c0 != &local_4b0) {
    uVar16 = local_4b0;
  }
  if (uVar16 < (ulong)(local_458 + local_4b8)) {
    uVar16 = 0xf;
    if (local_460 != local_450) {
      uVar16 = local_450[0];
    }
    if (uVar16 < (ulong)(local_458 + local_4b8)) goto LAB_00119be4;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,(ulong)local_4c0);
  }
  else {
LAB_00119be4:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4c0,(ulong)local_460);
  }
  local_4a0 = &local_490;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_490 = *plVar8;
    uStack_488 = puVar9[3];
  }
  else {
    local_490 = *plVar8;
    local_4a0 = (long *)*puVar9;
  }
  local_498 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_4a0);
  local_2b8 = &local_2a8;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_2a8 = *plVar11;
    lStack_2a0 = plVar8[3];
  }
  else {
    local_2a8 = *plVar11;
    local_2b8 = (long *)*plVar8;
  }
  local_2b0 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  ppcVar13 = (char **)(plVar8 + 2);
  if ((char **)*plVar8 == ppcVar13) {
    local_410 = *ppcVar13;
    lStack_408 = plVar8[3];
    local_420 = &local_410;
  }
  else {
    local_410 = *ppcVar13;
    local_420 = (char **)*plVar8;
  }
  local_418 = plVar8[1];
  *plVar8 = (long)ppcVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  UVar2 = (this->options->dgOptions).DDAOptions.super_DataDependenceAnalysisOptions.
          undefinedFunsBehavior;
  local_540 = &local_530;
  if (UVar2 == PURE) {
    local_530 = 0x65727570;
    local_538 = (char *)0x4;
    uStack_52c = uStack_52c & 0xffffff00;
  }
  else {
    local_538 = (char *)0x0;
    local_530 = local_530 & 0xffffff00;
    if (((UVar2 & (WRITE_ARGS|WRITE_ANY)) != PURE) &&
       ((std::__cxx11::string::_M_replace((ulong)&local_540,0,(char *)0x0,0x12b94d),
        (UVar2 & WRITE_ANY) != PURE || ((UVar2 & WRITE_ARGS) != PURE)))) {
      std::__cxx11::string::append((char *)&local_540);
    }
    if ((UVar2 & (READ_ARGS|READ_ANY)) != PURE) {
      if ((UVar2 & (WRITE_ARGS|WRITE_ANY)) == PURE) {
        std::__cxx11::string::_M_replace((ulong)&local_540,0,local_538,0x12b962);
      }
      else {
        std::__cxx11::string::append((char *)&local_540);
      }
      if (((UVar2 & READ_ANY) != PURE) || ((UVar2 & READ_ARGS) != PURE)) {
        std::__cxx11::string::append((char *)&local_540);
      }
    }
  }
  pcVar17 = (char *)0xf;
  if (local_420 != &local_410) {
    pcVar17 = local_410;
  }
  if (pcVar17 < local_538 + local_418) {
    pcVar17 = (char *)0xf;
    if (local_540 != &local_530) {
      pcVar17 = (char *)CONCAT44(uStack_52c,local_530);
    }
    if (local_538 + local_418 <= pcVar17) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_540,0,(char *)0x0,(ulong)local_420);
      goto LAB_00119e96;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_420,(ulong)local_540);
LAB_00119e96:
  local_520 = &local_510;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_510 = *plVar8;
    uStack_508 = puVar9[3];
  }
  else {
    local_510 = *plVar8;
    local_520 = (long *)*puVar9;
  }
  local_518 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_520);
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_4f0 = *plVar11;
    lStack_4e8 = plVar8[3];
    local_500 = &local_4f0;
  }
  else {
    local_4f0 = *plVar11;
    local_500 = (long *)*plVar8;
  }
  local_4f8 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_500);
  local_480 = &local_470;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_470 = *plVar11;
    lStack_468 = plVar8[3];
  }
  else {
    local_470 = *plVar11;
    local_480 = (long *)*plVar8;
  }
  local_478 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_500 != &local_4f0) {
    operator_delete(local_500,local_4f0 + 1);
  }
  if (local_520 != &local_510) {
    operator_delete(local_520,local_510 + 1);
  }
  if (local_540 != &local_530) {
    operator_delete(local_540,CONCAT44(uStack_52c,local_530) + 1);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420,(ulong)(local_410 + 1));
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,local_2a8 + 1);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0,local_490 + 1);
  }
  if (local_460 != local_450) {
    operator_delete(local_460,local_450[0] + 1);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0,local_4b0 + 1);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if (local_4e0 != &local_4d0) {
    operator_delete(local_4e0,local_4d0 + 1);
  }
  if (local_3f8 != local_3e8) {
    operator_delete(local_3f8,local_3e8[0] + 1);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440,local_430 + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,local_308 + 1);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338,local_328 + 1);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358,local_348 + 1);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,local_368 + 1);
  }
  if (local_398 != &local_388) {
    operator_delete(local_398,local_388 + 1);
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,local_3a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((this->options->dgOptions).PTAOptions.analysisType < 4) {
    std::__cxx11::string::append((char *)&local_480);
  }
  std::__cxx11::string::append((char *)&local_480);
  uVar16 = (this->options->dgOptions).PTAOptions.super_PointerAnalysisOptions.super_AnalysisOptions.
           fieldSensitivity.offset;
  if (uVar16 == dg::Offset::UNKNOWN) {
    std::__cxx11::string::append((char *)&local_480);
  }
  else {
    cVar15 = '\x01';
    if (9 < uVar16) {
      uVar14 = uVar16;
      cVar7 = '\x04';
      do {
        cVar15 = cVar7;
        if (uVar14 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_0011a2ea;
        }
        if (uVar14 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_0011a2ea;
        }
        if (uVar14 < 10000) goto LAB_0011a2ea;
        bVar1 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar7 = cVar15 + '\x04';
      } while (bVar1);
      cVar15 = cVar15 + '\x01';
    }
LAB_0011a2ea:
    local_520 = &local_510;
    std::__cxx11::string::_M_construct((ulong)&local_520,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_520,(uint)local_518,uVar16);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_520);
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_4f0 = *plVar11;
      lStack_4e8 = plVar8[3];
      local_500 = &local_4f0;
    }
    else {
      local_4f0 = *plVar11;
      local_500 = (long *)*plVar8;
    }
    local_4f8 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_500);
    if (local_500 != &local_4f0) {
      operator_delete(local_500,local_4f0 + 1);
    }
    if (local_520 != &local_510) {
      operator_delete(local_520,local_510 + 1);
    }
  }
  prVar10 = (raw_ostream *)llvm::errs();
  Str.Length = 0x2c;
  Str.Data = "[llvm-slicer] Saving IR with annotations to ";
  prVar10 = llvm::raw_ostream::operator<<(prVar10,Str);
  prVar10 = (raw_ostream *)llvm::raw_ostream::write((char *)prVar10,(ulong)local_3d8[0]);
  Str_00.Length = 1;
  Str_00.Data = "\n";
  llvm::raw_ostream::operator<<(prVar10,Str_00);
  plVar8 = (long *)operator_new(0x48);
  AVar3 = this->annotationOptions;
  pLVar5 = this->dg;
  *plVar8 = (long)&PTR__LLVMDGAssemblyAnnotationWriter_00134b38;
  *(AnnotationOptsT *)(plVar8 + 1) = AVar3;
  lVar6 = *(long *)(pLVar5 + 0x150);
  plVar8[2] = *(long *)(pLVar5 + 0x148);
  plVar8[3] = lVar6;
  plVar8[4] = (long)local_400;
  plVar8[5] = (long)(plVar8 + 7);
  plVar8[6] = 0;
  *(undefined1 *)(plVar8 + 7) = 0;
  std::__cxx11::string::operator=((string *)(plVar8 + 5),(string *)&local_480);
  llvm::Module::print(*(raw_ostream **)(this->dg + 0x140),(AssemblyAnnotationWriter *)&local_298,
                      SUB81(plVar8,0),false);
  (**(code **)(*plVar8 + 8))(plVar8);
  if (local_480 != &local_470) {
    operator_delete(local_480,local_470 + 1);
  }
  llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)&local_298);
  local_230 = (long *)_VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _vtable;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_3d8[0] != local_3c8) {
    operator_delete(local_3d8[0],local_3c8[0] + 1);
  }
  return;
}

Assistant:

void annotate(const std::set<LLVMNode *> *criteria = nullptr) {
        // compose name
        std::string fl(options.inputFile);
        replace_suffix(fl, "-debug.ll");

        // open stream to write to
        std::ofstream ofs(fl);
        llvm::raw_os_ostream outputstream(ofs);

        std::string module_comment =
                "; -- Generated by llvm-slicer --\n"
                ";   * slicing criteria: '" +
                options.slicingCriteria + "'\n" +
                ";   * legacy slicing criteria: '" +
                options.legacySlicingCriteria + "'\n" +
                ";   * legacy secondary slicing criteria: '" +
                options.legacySecondarySlicingCriteria + "'\n" +
                ";   * forward slice: '" +
                std::to_string(options.forwardSlicing) + "'\n" +
                ";   * remove slicing criteria: '" +
                std::to_string(options.removeSlicingCriteria) + "'\n" +
                ";   * undefined functions behavior: '" +
                undefFunsBehaviorToStr(
                        options.dgOptions.DDAOptions.undefinedFunsBehavior) +
                "'\n" + ";   * pointer analysis: ";

        using AnalysisType = LLVMPointerAnalysisOptions::AnalysisType;
        switch (options.dgOptions.PTAOptions.analysisType) {
        case AnalysisType::fi:
            module_comment += "flow-insensitive\n";
            break;
        case AnalysisType::fs:
            module_comment += "flow-sensitive\n";
            break;
        case AnalysisType::inv:
            module_comment += "flow-sensitive with invalidate\n";
            break;
        case AnalysisType::svf:
            module_comment += "SVF\n";
            break;
        }

        module_comment += ";   * PTA field sensitivity: ";
        if (options.dgOptions.PTAOptions.fieldSensitivity == Offset::UNKNOWN)
            module_comment += "full\n\n";
        else
            module_comment +=
                    std::to_string(
                            *options.dgOptions.PTAOptions.fieldSensitivity) +
                    "\n\n";

        llvm::errs() << "[llvm-slicer] Saving IR with annotations to " << fl
                     << "\n";
        auto *annot = new dg::debug::LLVMDGAssemblyAnnotationWriter(
                annotationOptions, dg->getPTA(), dg->getDDA(), criteria);
        annot->emitModuleComment(std::move(module_comment));
        llvm::Module *M = dg->getModule();
        M->print(outputstream, annot);

        delete annot;
    }